

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Chan::process(V2Chan *this,int nsamples)

{
  StereoSample *dest;
  
  dest = this->inst->chanbuf;
  accumulate(this,dest,this->inst->auxabuf,nsamples,this->aarcv);
  accumulate(this,dest,this->inst->auxbbuf,nsamples,this->abrcv);
  V2DCFilter::renderStereo(&this->dcf1,dest,dest,nsamples);
  V2Comp::render(&this->comp,dest,nsamples);
  V2Boost::render(&this->boost,dest,nsamples);
  if (this->fxr == 0) {
    V2Dist::renderStereo(&this->dist,dest,dest,nsamples);
    V2DCFilter::renderStereo(&this->dcf2,dest,dest,nsamples);
    V2ModDel::renderChan(&this->chorus,dest,nsamples);
  }
  else {
    V2ModDel::renderChan(&this->chorus,dest,nsamples);
    V2Dist::renderStereo(&this->dist,dest,dest,nsamples);
    V2DCFilter::renderStereo(&this->dcf2,dest,dest,nsamples);
  }
  accumulateMonoMix(this,this->inst->aux1buf,dest,nsamples,this->a1gain);
  accumulateMonoMix(this,this->inst->aux2buf,dest,nsamples,this->a2gain);
  accumulate(this,this->inst->auxabuf,dest,nsamples,this->aasnd);
  accumulate(this,this->inst->auxbbuf,dest,nsamples,this->absnd);
  accumulate(this,this->inst->mixbuf,dest,nsamples,this->chgain);
  return;
}

Assistant:

void process(int nsamples)
    {
        StereoSample *chan = inst->chanbuf;

        // AuxA/B receive (stereo)
        accumulate(chan, inst->auxabuf, nsamples, aarcv);
        accumulate(chan, inst->auxbbuf, nsamples, abrcv);

        // Filters
        dcf1.renderStereo(chan, chan, nsamples);
        DEBUG_PLOT_STEREO(&dcf1, chan, nsamples);
        comp.render(chan, nsamples);
        boost.render(chan, nsamples);
        if (fxr == FXR_DIST_THEN_CHORUS)
        {
            dist.renderStereo(chan, chan, nsamples);
            dcf2.renderStereo(chan, chan, nsamples);
            chorus.renderChan(chan, nsamples);
        }
        else // FXR_CHORUS_THEN_DIST
        {
            chorus.renderChan(chan, nsamples);
            dist.renderStereo(chan, chan, nsamples);
            dcf2.renderStereo(chan, chan, nsamples);
        }

        // Aux1/2 send (mono)
        accumulateMonoMix(inst->aux1buf, chan, nsamples, a1gain);
        accumulateMonoMix(inst->aux2buf, chan, nsamples, a2gain);

        // AuxA/B send (stereo)
        accumulate(inst->auxabuf, chan, nsamples, aasnd);
        accumulate(inst->auxbbuf, chan, nsamples, absnd);

        // Channel buffer to mix buffer (stereo)
        accumulate(inst->mixbuf, chan, nsamples, chgain);

        DEBUG_PLOT_STEREO(this, chan, nsamples);
    }